

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

integerPart llvm::ulpsFromBoundary(integerPart *parts,uint bits,bool isNearest)

{
  byte bVar1;
  ulong uVar2;
  ulong local_38;
  integerPart boundary;
  integerPart part;
  uint partBits;
  uint count;
  bool isNearest_local;
  uint bits_local;
  integerPart *parts_local;
  
  if (bits == 0) {
    __assert_fail("bits != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x1ee,
                  "APFloatBase::integerPart llvm::ulpsFromBoundary(const APFloatBase::integerPart *, unsigned int, bool)"
                 );
  }
  part._4_4_ = bits - 1 >> 6;
  bVar1 = (byte)(bits - 1);
  uVar2 = parts[part._4_4_] & 0xffffffffffffffffU >> (0x40 - ((bVar1 & 0x3f) + 1) & 0x3f);
  if (isNearest) {
    local_38 = 1L << (bVar1 & 0x3f);
  }
  else {
    local_38 = 0;
  }
  if (part._4_4_ == 0) {
    if (local_38 - uVar2 < uVar2 - local_38) {
      parts_local = (integerPart *)(local_38 - uVar2);
    }
    else {
      parts_local = (integerPart *)(uVar2 - local_38);
    }
  }
  else if (uVar2 == local_38) {
    do {
      part._4_4_ = part._4_4_ - 1;
      if (part._4_4_ == 0) {
        return *parts;
      }
    } while (parts[part._4_4_] == 0);
    parts_local = (integerPart *)0xffffffffffffffff;
  }
  else if (uVar2 == local_38 - 1) {
    do {
      part._4_4_ = part._4_4_ - 1;
      if (part._4_4_ == 0) {
        return -*parts;
      }
    } while (parts[part._4_4_] == 0xffffffffffffffff);
    parts_local = (integerPart *)0xffffffffffffffff;
  }
  else {
    parts_local = (integerPart *)0xffffffffffffffff;
  }
  return (integerPart)parts_local;
}

Assistant:

static APFloatBase::integerPart
ulpsFromBoundary(const APFloatBase::integerPart *parts, unsigned int bits,
                 bool isNearest) {
  unsigned int count, partBits;
  APFloatBase::integerPart part, boundary;

  assert(bits != 0);

  bits--;
  count = bits / APFloatBase::integerPartWidth;
  partBits = bits % APFloatBase::integerPartWidth + 1;

  part = parts[count] & (~(APFloatBase::integerPart) 0 >> (APFloatBase::integerPartWidth - partBits));

  if (isNearest)
    boundary = (APFloatBase::integerPart) 1 << (partBits - 1);
  else
    boundary = 0;

  if (count == 0) {
    if (part - boundary <= boundary - part)
      return part - boundary;
    else
      return boundary - part;
  }

  if (part == boundary) {
    while (--count)
      if (parts[count])
        return ~(APFloatBase::integerPart) 0; /* A lot.  */

    return parts[0];
  } else if (part == boundary - 1) {
    while (--count)
      if (~parts[count])
        return ~(APFloatBase::integerPart) 0; /* A lot.  */

    return -parts[0];
  }

  return ~(APFloatBase::integerPart) 0; /* A lot.  */
}